

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O2

void __thiscall TimeOffsets::Add(TimeOffsets *this,seconds offset)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  size_type sVar3;
  Logger *pLVar4;
  unsigned_long *args_1;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  size_type local_e8;
  rep local_e0;
  seconds offset_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (unsigned_long *)0x18;
  offset_local = offset;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
             ,0x18,false);
  this_00 = &this->m_offsets;
  sVar3 = std::
          deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          ::size(this_00);
  if (0x31 < sVar3) {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::pop_front(this_00);
  }
  std::
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::push_back(this_00,&offset_local);
  pLVar4 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
  if (bVar2) {
    local_e0 = offset_local.__r;
    local_e8 = std::
               deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               ::size(this_00);
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<long,unsigned_long>
                (&local_58,(tinyformat *)"Added time offset %+ds, total samples %d\n",
                 (char *)&local_e0,(long *)&local_e8,args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pLVar4 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x5d;
      local_58._M_string_length = 0x6bc2c2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      source_file._M_len = 0x5d;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "Add";
      logging_function._M_len = 3;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x1f,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TimeOffsets::Add(std::chrono::seconds offset)
{
    LOCK(m_mutex);

    if (m_offsets.size() >= MAX_SIZE) {
        m_offsets.pop_front();
    }
    m_offsets.push_back(offset);
    LogDebug(BCLog::NET, "Added time offset %+ds, total samples %d\n",
             Ticks<std::chrono::seconds>(offset), m_offsets.size());
}